

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

void __thiscall
myvk::QueueSelectionResolver::EnumerateDeviceQueueCreateInfos
          (QueueSelectionResolver *this,
          vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
          *out_create_infos,vector<float,_std::allocator<float>_> *out_priorities)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  pointer pfVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  size_type __new_size;
  VkDeviceQueueCreateInfo info;
  
  pVVar2 = (out_create_infos->
           super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out_create_infos->
      super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>)._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (out_create_infos->
    super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  pfVar3 = (out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = pfVar3;
  }
  if ((this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = &(this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header;
    __new_size = 0;
    for (p_Var5 = (this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      uVar4 = ((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent) / 0x18;
      if (__new_size < uVar4) {
        __new_size = uVar4 & 0xffffffff;
      }
    }
    info.sType = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (out_priorities,__new_size,(value_type_conflict3 *)&info);
    for (p_Var5 = (this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      info.pNext = (void *)0x0;
      info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      info._4_4_ = 0;
      info._16_8_ = (ulong)p_Var5[1]._M_color << 0x20;
      info._24_8_ = ((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent) / 0x18 & 0xffffffff;
      info.pQueuePriorities =
           (out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::push_back
                (out_create_infos,&info);
    }
  }
  return;
}

Assistant:

void QueueSelectionResolver::EnumerateDeviceQueueCreateInfos(std::vector<VkDeviceQueueCreateInfo> *out_create_infos,
                                                             std::vector<float> *out_priorities) const {
	out_create_infos->clear();
	out_priorities->clear();

	if (m_queue_creations.empty())
		return;

	uint32_t max_queue_count = 0;
	for (const auto &i : m_queue_creations) {
		if (i.second.size() > max_queue_count)
			max_queue_count = i.second.size();
	}
	out_priorities->resize(max_queue_count, 1.0f);

	for (const auto &i : m_queue_creations) {
		VkDeviceQueueCreateInfo info = {};
		info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
		info.queueFamilyIndex = i.first;
		info.queueCount = i.second.size();
		info.pQueuePriorities = out_priorities->data();
		out_create_infos->push_back(info);
	}
}